

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintChoiceStats(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  
  pGVar6 = p;
  Gia_ManMarkFanoutDrivers(p);
  uVar1 = p->nObjs;
  if ((long)(int)uVar1 < 1) {
LAB_002189c9:
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    pGVar2 = p->pObjs;
    pGVar6 = (Gia_Man_t *)0x0;
    uVar4 = 0;
    uVar5 = 0;
    pGVar7 = pGVar2;
    do {
      if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_002189c9;
      uVar8 = (uint)*(undefined8 *)pGVar7;
      if ((((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
          (piVar3 = p->pSibls, piVar3 != (int *)0x0)) && (piVar3[(long)pGVar6] != 0)) {
        if (uVar1 <= (uint)piVar3[(long)pGVar6]) {
LAB_002189e4:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((pGVar2[(uint)piVar3[(long)pGVar6]].field_0x3 & 0x40) != 0) {
          __assert_fail("!Gia_ObjSiblObj(p, i)->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x19c,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
        }
        if (uVar1 <= (uint)piVar3[(long)pGVar6]) goto LAB_002189e4;
        if (((int)(uint)*(undefined8 *)(pGVar2 + (uint)piVar3[(long)pGVar6]) < 0) ||
           (((uint)*(undefined8 *)(pGVar2 + (uint)piVar3[(long)pGVar6]) & 0x1fffffff) == 0x1fffffff)
           ) {
          __assert_fail("Gia_ObjIsAnd(Gia_ObjSiblObj(p, i))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x19d,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
        }
        uVar5 = (ulong)((int)uVar5 + 1);
        uVar4 = (ulong)((uVar8 >> 0x1e) + (int)uVar4);
      }
      pGVar6 = (Gia_Man_t *)((long)&pGVar6->pName + 1);
      pGVar7 = pGVar7 + 1;
    } while ((Gia_Man_t *)(long)(int)uVar1 != pGVar6);
  }
  Abc_Print((int)pGVar6,"Choice stats: Equivs =%7d. Choices =%7d.\n",uVar5,uVar4);
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrintChoiceStats( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nEquivs = 0, nChoices = 0;
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjSibl(p, i) )
            continue;
        nEquivs++;
        if ( pObj->fMark0 )
            nChoices++;
        assert( !Gia_ObjSiblObj(p, i)->fMark0 );
        assert( Gia_ObjIsAnd(Gia_ObjSiblObj(p, i)) );
    }
    Abc_Print( 1, "Choice stats: Equivs =%7d. Choices =%7d.\n", nEquivs, nChoices );
    Gia_ManCleanMark0( p );
}